

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O0

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall VariationIndex::_getInsertions(VariationIndex *this,int chromosome_id,size_t position)

{
  bool bVar1;
  mapped_type *this_00;
  ulong __n;
  size_type sVar2;
  const_reference pvVar3;
  value_type_conflict3 *pvVar4;
  const_reference pvVar5;
  pointer pvVar6;
  ulong in_RCX;
  unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  event_t *event;
  size_t i;
  vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_> *event_list;
  size_t k;
  chromosome_record_t *chromosome_record;
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *result;
  unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  *in_stack_ffffffffffffff58;
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffff60;
  value_type_conflict3 *__x;
  _Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false> k_00;
  value_type_conflict3 *local_58;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  local_30;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  local_28;
  ulong local_20;
  
  k_00._M_head_impl = in_RDI;
  local_20 = in_RCX;
  local_28.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x2a56c1);
  local_30.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
          ::operator==(&local_28,&local_30);
  if (bVar1) {
    std::
    unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
    ::unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    this_00 = boost::unordered::
              unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
              ::operator[](in_RSI,(key_type *)k_00._M_head_impl);
    __n = (local_20 - 1) / *(ulong *)&in_RSI[2].table_.mlf_;
    sVar2 = std::vector<VariationIndex::checkpoint_t,_std::allocator<VariationIndex::checkpoint_t>_>
            ::size(&this_00->checkpoint_list);
    if (__n < sVar2) {
      std::
      unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::
      unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      pvVar3 = std::
               vector<VariationIndex::checkpoint_t,_std::allocator<VariationIndex::checkpoint_t>_>::
               operator[](&this_00->checkpoint_list,__n);
      local_58 = (value_type_conflict3 *)pvVar3->index;
      while ((__x = local_58,
             pvVar4 = (value_type_conflict3 *)
                      std::vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_>
                      ::size(&this_00->events), __x < pvVar4 &&
             (pvVar5 = std::
                       vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_>::
                       operator[](&this_00->events,(size_type)local_58),
             pvVar5->position <= local_20))) {
        if ((pvVar5->position == local_20) && (pvVar5->type == INSERTION)) {
          pvVar6 = std::
                   unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::get(in_stack_ffffffffffffff60);
          if (pvVar6 == (pointer)0x0) {
            in_stack_ffffffffffffff60 =
                 (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)operator_new(0x18);
            memset(in_stack_ffffffffffffff60,0,0x18);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a584f);
            std::
            unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ::
            unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                      (in_stack_ffffffffffffff60,(pointer)in_stack_ffffffffffffff58);
            std::
            unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator=(in_stack_ffffffffffffff60,
                        (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)in_stack_ffffffffffffff58);
            std::
            unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::~unique_ptr(in_stack_ffffffffffffff60);
          }
          std::
          unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::operator->((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)0x2a589d);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RDI,__x);
        }
        local_58 = (value_type_conflict3 *)((long)local_58 + 1);
      }
    }
    else {
      std::
      unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::
      unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )k_00._M_head_impl;
}

Assistant:

std::unique_ptr<std::vector<size_t> > VariationIndex::_getInsertions(int chromosome_id, size_t position) {
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (position-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const vector<event_t>& event_list = chromosome_record.events;
	unique_ptr<vector<size_t> > result(nullptr);
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position > position) break;
		if ((event.position == position) && (event.type == INSERTION)) {
			if (result.get() == 0) {
				result = unique_ptr<vector<size_t> >(new vector<size_t>());
			}
			result->push_back(event.variation_index);
		}
	}
	return result;
}